

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cast.hpp
# Opt level: O3

uint Diligent::StaticCast<unsigned_int,unsigned_long>(unsigned_long *Src)

{
  ulong uVar1;
  string msg;
  string local_30;
  
  uVar1 = *Src;
  if (uVar1 >> 0x20 != 0) {
    FormatString<char[20]>(&local_30,(char (*) [20])"Cast will lose data");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"StaticCast",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Cast.hpp"
               ,0x40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    uVar1 = *Src;
  }
  return (uint)uVar1;
}

Assistant:

NODISCARD DstType StaticCast(const SrcType& Src)
{
#ifdef DILIGENT_DEBUG
    using MaxType = decltype(DstType{1} + SrcType{1});
    VERIFY(static_cast<MaxType>(Src) == static_cast<MaxType>(static_cast<DstType>(Src)), "Cast will lose data");
#endif
    return static_cast<DstType>(Src);
}